

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_write_set_format_by_name.c
# Opt level: O3

void test_format_by_name(char *format_name,char *compression_type,int format_id,int dot_stored,
                        void *image,size_t image_size)

{
  size_t l;
  int iVar1;
  mode_t mVar2;
  void *buff;
  archive *paVar3;
  archive_entry *entry;
  time_t tVar4;
  char *pcVar5;
  ssize_t v2;
  int64_t v2_00;
  char *e1;
  char *v1;
  wchar_t wVar6;
  archive_entry *ae;
  size_t used;
  archive_entry *local_50;
  size_t local_48;
  void *local_40;
  size_t local_38;
  
  local_40 = image;
  buff = malloc(0x100000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                   ,L')',(uint)(buff != (void *)0x0),"(buff = malloc(buffsize)) != NULL",(void *)0x0
                  );
  if (buff != (void *)0x0) {
    paVar3 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                     ,L'.',(uint)(paVar3 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_write_set_format_by_name(paVar3,format_name);
    if (iVar1 == -0x14) {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                     ,L'1');
      test_skipping("%s format not fully supported on this platform",compression_type);
      iVar1 = archive_write_free(paVar3);
      wVar6 = L'3';
LAB_00134fbe:
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                          ,wVar6,0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      free(buff);
      return;
    }
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                        ,L'7',0,"ARCHIVE_OK",(long)iVar1,"r",paVar3);
    if (compression_type != (char *)0x0) {
      iVar1 = archive_write_set_format_option(paVar3,format_name,"compression",compression_type);
      if (iVar1 != 0) {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                       ,L';');
        test_skipping("%s writing not fully supported on this platform",compression_type);
        iVar1 = archive_write_free(paVar3);
        wVar6 = L'=';
        goto LAB_00134fbe;
      }
    }
    iVar1 = archive_write_add_filter_none(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                        ,L'A',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",paVar3);
    iVar1 = archive_write_open_memory(paVar3,buff,0x100000,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                        ,L'C',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_open_memory(a, buff, buffsize, &used)",paVar3);
    entry = archive_entry_new();
    local_50 = entry;
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                     ,L'H',(uint)(entry != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_mtime(entry,1,0);
    tVar4 = archive_entry_mtime(entry);
    local_48 = image_size;
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                        ,L'J',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
    archive_entry_set_ctime(entry,1,0);
    tVar4 = archive_entry_ctime(entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                        ,L'L',1,"1",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
    archive_entry_set_atime(entry,1,0);
    tVar4 = archive_entry_atime(entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                        ,L'N',1,"1",tVar4,"archive_entry_atime(ae)",(void *)0x0);
    archive_entry_copy_pathname(entry,"file");
    pcVar5 = archive_entry_pathname(entry);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
               ,L'P',"file","\"file\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    archive_entry_set_mode(entry,0x81ed);
    mVar2 = archive_entry_mode(entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                        ,L'R',0x81ed,"(AE_IFREG | 0755)",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
    archive_entry_set_size(entry,8);
    iVar1 = archive_write_header(paVar3,entry);
    l = local_48;
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                        ,L'T',0,"0",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
    archive_entry_free(entry);
    v2 = archive_write_data(paVar3,"12345678",8);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                        ,L'V',8,"8",v2,"archive_write_data(a, \"12345678\", 8)",(void *)0x0);
    iVar1 = archive_write_close(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                        ,L'Y',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar3);
    iVar1 = archive_write_free(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                        ,L'Z',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    if (l != 0 && local_40 != (void *)0x0) {
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                          ,L']',buff,"buff",local_40,"image",l,"image_size",(void *)0x0);
    }
    if (0 < format_id) {
      paVar3 = archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                       ,L'd',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_read_support_format_all(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                          ,L'f',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                          paVar3);
      iVar1 = archive_read_support_filter_all(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                          ,L'h',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                          paVar3);
      iVar1 = read_open_memory_seek(paVar3,buff,local_38,7);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                          ,L'j',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory_seek(a, buff, used, 7)"
                          ,paVar3);
      if ((dot_stored & 1U) != 0) {
        iVar1 = archive_read_next_header(paVar3,&local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                            ,L'n',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                            paVar3);
        pcVar5 = archive_entry_pathname(local_50);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                   ,L'o',".","\".\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
        mVar2 = archive_entry_filetype(local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                            ,L'p',0x4000,"AE_IFDIR",(ulong)mVar2,"archive_entry_filetype(ae)",
                            (void *)0x0);
      }
      iVar1 = archive_read_next_header(paVar3,&local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                          ,L'u',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3
                         );
      tVar4 = archive_entry_mtime(local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                          ,L'v',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
      pcVar5 = archive_entry_pathname(local_50);
      if ((dot_stored & 2U) == 0) {
        v1 = "file";
        e1 = "\"file\"";
        wVar6 = L'z';
      }
      else {
        v1 = "./file";
        e1 = "\"./file\"";
        wVar6 = L'x';
      }
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                 ,wVar6,v1,e1,pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      mVar2 = archive_entry_filetype(local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                          ,L'|',0x8000,"AE_IFREG",(ulong)mVar2,"archive_entry_filetype(ae)",
                          (void *)0x0);
      v2_00 = archive_entry_size(local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                          ,L'}',8,"8",v2_00,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar3,&local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                          ,L'\x80',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar3);
      iVar1 = archive_filter_code(paVar3,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                          ,L'\x84',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                          paVar3);
      iVar1 = archive_format(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                          ,L'\x85',(ulong)(uint)format_id,"format_id",(long)iVar1,
                          "archive_format(a)",paVar3);
      iVar1 = archive_read_close(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                          ,L'\x87',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
      iVar1 = archive_read_free(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                          ,L'\x88',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    }
    free(buff);
  }
  return;
}

Assistant:

static void
test_format_by_name(const char *format_name, const char *compression_type,
    int format_id, int dot_stored, const void *image, size_t image_size)
{
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	size_t buffsize = 1024 * 1024;
	char *buff;
	int r;

	assert((buff = malloc(buffsize)) != NULL);
	if (buff == NULL)
		return;

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	r = archive_write_set_format_by_name(a, format_name);
	if (r == ARCHIVE_WARN) {
		skipping("%s format not fully supported on this platform",
		   compression_type);
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK, r);
	if (compression_type != NULL &&
	    ARCHIVE_OK != archive_write_set_format_option(a, format_name,
	    "compression", compression_type)) {
		skipping("%s writing not fully supported on this platform",
		   compression_type);
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 0);
	assertEqualInt(1, archive_entry_mtime(ae));
	archive_entry_set_ctime(ae, 1, 0);
	assertEqualInt(1, archive_entry_ctime(ae));
	archive_entry_set_atime(ae, 1, 0);
	assertEqualInt(1, archive_entry_atime(ae));
	archive_entry_copy_pathname(ae, "file");
	assertEqualString("file", archive_entry_pathname(ae));
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	assertEqualInt((AE_IFREG | 0755), archive_entry_mode(ae));
	archive_entry_set_size(ae, 8);
	assertEqualInt(0, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(8, archive_write_data(a, "12345678", 8));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	if (image && image_size > 0) {
		assertEqualMem(buff, image, image_size);
	}
	if (format_id > 0) {
		/*
		 * Now, read the data back.
		 */
		/* With the test memory reader -- seeking mode. */
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_format_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    read_open_memory_seek(a, buff, used, 7));

		if (dot_stored & 1) {
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_next_header(a, &ae));
			assertEqualString(".", archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
		}
		/*
		 * Read and verify the file.
		 */
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualInt(1, archive_entry_mtime(ae));
		if (dot_stored & 2) {
			assertEqualString("./file", archive_entry_pathname(ae));
		} else {
			assertEqualString("file", archive_entry_pathname(ae));
		}
		assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
		assertEqualInt(8, archive_entry_size(ae));

		/* Verify the end of the archive. */
		assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

		/* Verify archive format. */
		assertEqualIntA(a, ARCHIVE_FILTER_NONE,
		    archive_filter_code(a, 0));
		assertEqualIntA(a, format_id, archive_format(a));

		assertEqualInt(ARCHIVE_OK, archive_read_close(a));
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	}
	free(buff);
}